

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O0

void iDynTree::computeTransformToTraversalBaseWithAdditionalTransform
               (Model *fullModel,Traversal *subModelTraversal,JointPosDoubleArray *jointPos,
               LinkPositions *traversalBase_H_link,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
               *newLink_H_oldLink)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  pointer pvVar5;
  Transform *pTVar6;
  LinkIndex LVar7;
  LinkIndex LVar8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  *in_RCX;
  undefined8 in_RDX;
  LinkIndex in_stack_00000030;
  Model *in_stack_00000038;
  const_iterator it;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  *in_stack_fffffffffffffe48;
  Traversal *in_stack_fffffffffffffe50;
  Transform local_148 [96];
  Transform local_e8 [96];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_true>
  local_88 [3];
  string local_70 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_true>
  local_50;
  Traversal *local_48;
  Link *local_40;
  Link *local_38;
  uint local_2c;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
  *local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_2c = 0; uVar1 = local_2c, uVar4 = Traversal::getNrOfVisitedLinks((Traversal *)0x458a72)
      , uVar1 < uVar4; local_2c = local_2c + 1) {
    local_38 = Traversal::getLink(in_stack_fffffffffffffe50,
                                  (TraversalIndex)in_stack_fffffffffffffe48);
    local_40 = Traversal::getParentLink
                         (in_stack_fffffffffffffe50,(TraversalIndex)in_stack_fffffffffffffe48);
    local_48 = (Traversal *)
               Traversal::getParentJoint
                         (in_stack_fffffffffffffe50,(TraversalIndex)in_stack_fffffffffffffe48);
    if (local_40 == (Link *)0x0) {
      Link::getIndex(local_38);
      Model::getLinkName_abi_cxx11_(in_stack_00000038,in_stack_00000030);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
           ::find(in_stack_fffffffffffffe48,(key_type *)0x458b39);
      std::__cxx11::string::~string(local_70);
      local_88[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
           ::end(in_stack_fffffffffffffe48);
      bVar3 = std::__detail::operator!=(&local_50,local_88);
      if (bVar3) {
        pvVar5 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_false,_true>
                               *)0x458b97);
        Link::getIndex(local_38);
        pTVar6 = LinkPositions::operator()
                           ((LinkPositions *)in_stack_fffffffffffffe50,
                            (LinkIndex)in_stack_fffffffffffffe48);
        iDynTree::Transform::operator=(pTVar6,&pvVar5->second);
      }
      else {
        iDynTree::Transform::Identity();
        Link::getIndex(local_38);
        pTVar6 = LinkPositions::operator()
                           ((LinkPositions *)in_stack_fffffffffffffe50,
                            (LinkIndex)in_stack_fffffffffffffe48);
        iDynTree::Transform::operator=(pTVar6,local_e8);
      }
    }
    else {
      in_stack_fffffffffffffe48 = local_20;
      Link::getIndex(local_40);
      pTVar6 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffe50,
                          (LinkIndex)in_stack_fffffffffffffe48);
      uVar2 = local_18;
      in_stack_fffffffffffffe50 = local_48;
      LVar7 = Link::getIndex(local_40);
      LVar8 = Link::getIndex(local_38);
      (*(code *)(in_stack_fffffffffffffe50->links).
                super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_start[10])
                (in_stack_fffffffffffffe50,uVar2,LVar7,LVar8);
      iDynTree::Transform::operator*(local_148,pTVar6);
      Link::getIndex(local_38);
      pTVar6 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffe50,
                          (LinkIndex)in_stack_fffffffffffffe48);
      iDynTree::Transform::operator=(pTVar6,local_148);
    }
  }
  return;
}

Assistant:

void computeTransformToTraversalBaseWithAdditionalTransform(const Model& fullModel,
                                                            const Traversal& subModelTraversal,
                                                            const JointPosDoubleArray& jointPos,
                                                                  LinkPositions& traversalBase_H_link,
                                                            const std::unordered_map<std::string, iDynTree::Transform>& newLink_H_oldLink)
{
    for(unsigned int traversalEl=0; traversalEl < subModelTraversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
        LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = subModelTraversal.getParentJoint(traversalEl);

        // If this is the traversal base
        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the base is simply
            // an identity transform, or a given transform if the link is in newLink_H_oldLink
            auto it = newLink_H_oldLink.find(fullModel.getLinkName(visitedLink->getIndex()));

            if (it != newLink_H_oldLink.end())
            {
                traversalBase_H_link(visitedLink->getIndex()) = it->second;
            }
            else
            {
                traversalBase_H_link(visitedLink->getIndex()) = iDynTree::Transform::Identity();
            }
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            traversalBase_H_link(visitedLink->getIndex()) =
                traversalBase_H_link(parentLink->getIndex())*
                    toParentJoint->getTransform(jointPos,parentLink->getIndex(),visitedLink->getIndex());
        }
    }

    return;
}